

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SentencePieceLearner.cc
# Opt level: O2

void __thiscall onmt::SentencePieceLearner::~SentencePieceLearner(SentencePieceLearner *this)

{
  ~SentencePieceLearner(this);
  operator_delete(this,0x78);
  return;
}

Assistant:

SentencePieceLearner::~SentencePieceLearner()
  {
    if (!_keep_input_file) {
      remove(_input_filename.c_str());
    }
  }